

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_set_grow(acmod_t *acmod,int grow_feat)

{
  byte bVar1;
  
  bVar1 = acmod->grow_feat;
  acmod->grow_feat = (uint8)grow_feat;
  if ((grow_feat != 0) && (acmod->n_feat_alloc < 0x80)) {
    acmod_grow_feat_buf(acmod,0x80);
  }
  return (uint)bVar1;
}

Assistant:

int
acmod_set_grow(acmod_t *acmod, int grow_feat)
{
    int tmp = acmod->grow_feat;
    acmod->grow_feat = grow_feat;

    /* Expand feat_buf to a reasonable size to start with. */
    if (grow_feat && acmod->n_feat_alloc < 128)
        acmod_grow_feat_buf(acmod, 128);

    return tmp;
}